

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O3

void __thiscall duckdb::WKBColumnWriterState::~WKBColumnWriterState(WKBColumnWriterState *this)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  __ptr;
  pointer pcVar2;
  
  _Var1._M_head_impl =
       (this->geo_data_writer).bbox_expr.
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  (this->geo_data_writer).bbox_expr.
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  _Var1._M_head_impl =
       (this->geo_data_writer).flag_expr.
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  (this->geo_data_writer).flag_expr.
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  _Var1._M_head_impl =
       (this->geo_data_writer).type_expr.
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  (this->geo_data_writer).type_expr.
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  DataChunk::~DataChunk(&(this->geo_data_writer).result_chunk);
  DataChunk::~DataChunk(&(this->geo_data_writer).input_chunk);
  __ptr.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl =
       (this->geo_data_writer).executor.
       super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
       .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>;
  if (__ptr.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl !=
      (ExpressionExecutor *)0x0) {
    ::std::default_delete<duckdb::ExpressionExecutor>::operator()
              ((default_delete<duckdb::ExpressionExecutor> *)&this->geo_data_writer,
               (ExpressionExecutor *)
               __ptr.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl);
  }
  (this->geo_data_writer).executor.
  super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>)0x0;
  pcVar2 = (this->geo_data).projjson._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->geo_data).projjson.field_2) {
    operator_delete(pcVar2);
  }
  ::std::
  _Rb_tree<duckdb::WKBGeometryType,_duckdb::WKBGeometryType,_std::_Identity<duckdb::WKBGeometryType>,_std::less<duckdb::WKBGeometryType>,_std::allocator<duckdb::WKBGeometryType>_>
  ::~_Rb_tree(&(this->geo_data).geometry_types._M_t);
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>::
  ~StandardColumnWriterState
            (&this->
              super_StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>
            );
  return;
}

Assistant:

WKBColumnWriterState(ParquetWriter &writer, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : StandardColumnWriterState(writer, row_group, col_idx), geo_data(), geo_data_writer(writer.GetContext()) {
	}